

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

void __thiscall
pbrt::Integrator::Integrator
          (Integrator *this,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *this_00;
  pointer pLVar1;
  iterator __position;
  LightHandle *light;
  pointer this_01;
  undefined1 auVar2 [16];
  string local_70;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_50;
  Bounds3f local_48;
  
  this_00 = &this->lights;
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_02eeaaa8;
  (this->aggregate).
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = 0;
  (this->aggregate).
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (aggregate->
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(this_00,lights);
  (this->infiniteLights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->infiniteLights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->infiniteLights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = this_00;
  if (((aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits & 0xffffffffffff) == 0) {
    auVar2._8_4_ = 0xff7fffff;
    auVar2._0_8_ = 0xff7fffffff7fffff;
    auVar2._12_4_ = 0xff7fffff;
    local_48.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    local_48.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    local_48.pMin.super_Tuple3<pbrt::Point3,_float>.z = 3.4028235e+38;
    local_48.pMax.super_Tuple3<pbrt::Point3,_float>.x = -3.4028235e+38;
    local_48.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_ = vmovlps_avx(auVar2);
  }
  else {
    PrimitiveHandle::Bounds(&local_48,aggregate);
  }
  if (LOGGING_LogLevel < 1) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    detail::stringPrintfRecursive<pbrt::Bounds3<float>&>(&local_70,"Scene bounds %s",&local_48);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.h"
        ,0x49,local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  this_01 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pLVar1) {
    do {
      LightHandle::Preprocess(this_01,&local_48);
      if (*(int *)((this_01->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits & 0xffffffffffff) == 3) {
        __position._M_current =
             (this->infiniteLights).
             super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->infiniteLights).
            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>::
          _M_realloc_insert<pbrt::LightHandle_const&>
                    ((vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>> *)
                     &this->infiniteLights,__position,this_01);
        }
        else {
          ((__position._M_current)->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = 0;
          ((__position._M_current)->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = (this_01->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          (this->infiniteLights).
          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pLVar1);
  }
  return;
}

Assistant:

Integrator(PrimitiveHandle aggregate, std::vector<LightHandle> lights)
        : aggregate(aggregate), lights(lights) {
        // Integrator constructor implementation
        Bounds3f sceneBounds = aggregate ? aggregate.Bounds() : Bounds3f();
        LOG_VERBOSE("Scene bounds %s", sceneBounds);
        for (auto &light : lights) {
            light.Preprocess(sceneBounds);
            if (light.Type() == LightType::Infinite)
                infiniteLights.push_back(light);
        }
    }